

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_devs.c
# Opt level: O1

int main(void)

{
  bool bVar1;
  FILE *__stream;
  uint uVar2;
  uint uVar3;
  PaVersionInfo *pPVar4;
  PaDeviceInfo *pPVar5;
  PaHostApiInfo *pPVar6;
  uint device;
  char *pcVar7;
  PaStreamParameters local_70;
  PaStreamParameters local_50;
  
  uVar2 = Pa_Initialize();
  if (uVar2 == 0) {
    uVar2 = Pa_GetVersion();
    printf("PortAudio version: 0x%08X\n",(ulong)uVar2);
    pPVar4 = Pa_GetVersionInfo();
    printf("Version text: \'%s\'\n",pPVar4->versionText);
    uVar2 = Pa_GetDeviceCount();
    if (-1 < (int)uVar2) {
      printf("Number of devices = %d\n",(ulong)uVar2);
      if (uVar2 != 0) {
        device = 0;
        do {
          pPVar5 = Pa_GetDeviceInfo(device);
          printf("--------------------------------------- device #%d\n",(ulong)device);
          uVar3 = Pa_GetDefaultInputDevice();
          if (device == uVar3) {
            printf("[ Default Input");
LAB_00107e5a:
            bVar1 = true;
            pcVar7 = ",";
          }
          else {
            pPVar6 = Pa_GetHostApiInfo(pPVar5->hostApi);
            bVar1 = false;
            pcVar7 = "[";
            if (device == pPVar6->defaultInputDevice) {
              pPVar6 = Pa_GetHostApiInfo(pPVar5->hostApi);
              printf("[ Default %s Input",pPVar6->name);
              goto LAB_00107e5a;
            }
          }
          uVar3 = Pa_GetDefaultOutputDevice();
          if (device == uVar3) {
            printf(pcVar7);
            printf(" Default Output");
LAB_00107ec0:
            bVar1 = true;
          }
          else {
            pPVar6 = Pa_GetHostApiInfo(pPVar5->hostApi);
            if (device == pPVar6->defaultOutputDevice) {
              pPVar6 = Pa_GetHostApiInfo(pPVar5->hostApi);
              printf(pcVar7);
              printf(" Default %s Output",pPVar6->name);
              goto LAB_00107ec0;
            }
          }
          if (bVar1) {
            puts(" ]");
          }
          printf("Name                        = %s\n",pPVar5->name);
          pPVar6 = Pa_GetHostApiInfo(pPVar5->hostApi);
          printf("Host API                    = %s\n",pPVar6->name);
          printf("Max inputs = %d",(ulong)(uint)pPVar5->maxInputChannels);
          printf(", Max outputs = %d\n",(ulong)(uint)pPVar5->maxOutputChannels);
          printf("Default low input latency   = %8.4f\n",SUB84(pPVar5->defaultLowInputLatency,0));
          printf("Default low output latency  = %8.4f\n",SUB84(pPVar5->defaultLowOutputLatency,0));
          printf("Default high input latency  = %8.4f\n",SUB84(pPVar5->defaultHighInputLatency,0));
          printf("Default high output latency = %8.4f\n",SUB84(pPVar5->defaultHighOutputLatency,0));
          printf("Default sample rate         = %8.2f\n",SUB84(pPVar5->defaultSampleRate,0));
          local_50.channelCount = pPVar5->maxInputChannels;
          local_50.sampleFormat = 8;
          local_50.suggestedLatency = 0.0;
          local_50.hostApiSpecificStreamInfo = (void *)0x0;
          local_70.channelCount = pPVar5->maxOutputChannels;
          local_70.sampleFormat = 8;
          local_70.suggestedLatency = 0.0;
          local_70.hostApiSpecificStreamInfo = (void *)0x0;
          local_70.device = device;
          local_50.device = device;
          if (0 < local_50.channelCount) {
            printf("Supported standard sample rates\n for half-duplex 16 bit %d channel input = \n")
            ;
            PrintSupportedStandardSampleRates(&local_50,(PaStreamParameters *)0x0);
          }
          if (0 < local_70.channelCount) {
            printf("Supported standard sample rates\n for half-duplex 16 bit %d channel output = \n"
                  );
            PrintSupportedStandardSampleRates((PaStreamParameters *)0x0,&local_70);
          }
          if (0 < local_70.channelCount && 0 < local_50.channelCount) {
            printf(
                  "Supported standard sample rates\n for full-duplex 16 bit %d channel input, %d channel output = \n"
                  );
            PrintSupportedStandardSampleRates(&local_50,&local_70);
          }
          device = device + 1;
        } while (uVar2 != device);
      }
      Pa_Terminate();
      puts("----------------------------------------------");
      return 0;
    }
    pcVar7 = "ERROR: Pa_GetDeviceCount returned 0x%x\n";
  }
  else {
    pcVar7 = "ERROR: Pa_Initialize returned 0x%x\n";
  }
  printf(pcVar7,(ulong)uVar2);
  Pa_Terminate();
  fprintf(_stderr,"Error number: %d\n",(ulong)uVar2);
  __stream = _stderr;
  pcVar7 = Pa_GetErrorText(uVar2);
  fprintf(__stream,"Error message: %s\n",pcVar7);
  return uVar2;
}

Assistant:

int main(void)
{
    int     i, numDevices, defaultDisplayed;
    const   PaDeviceInfo *deviceInfo;
    PaStreamParameters inputParameters, outputParameters;
    PaError err;

    
    err = Pa_Initialize();
    if( err != paNoError )
    {
        printf( "ERROR: Pa_Initialize returned 0x%x\n", err );
        goto error;
    }
    
    printf( "PortAudio version: 0x%08X\n", Pa_GetVersion());
    printf( "Version text: '%s'\n", Pa_GetVersionInfo()->versionText );

    numDevices = Pa_GetDeviceCount();
    if( numDevices < 0 )
    {
        printf( "ERROR: Pa_GetDeviceCount returned 0x%x\n", numDevices );
        err = numDevices;
        goto error;
    }
    
    printf( "Number of devices = %d\n", numDevices );
    for( i=0; i<numDevices; i++ )
    {
        deviceInfo = Pa_GetDeviceInfo( i );
        printf( "--------------------------------------- device #%d\n", i );
                
    /* Mark global and API specific default devices */
        defaultDisplayed = 0;
        if( i == Pa_GetDefaultInputDevice() )
        {
            printf( "[ Default Input" );
            defaultDisplayed = 1;
        }
        else if( i == Pa_GetHostApiInfo( deviceInfo->hostApi )->defaultInputDevice )
        {
            const PaHostApiInfo *hostInfo = Pa_GetHostApiInfo( deviceInfo->hostApi );
            printf( "[ Default %s Input", hostInfo->name );
            defaultDisplayed = 1;
        }
        
        if( i == Pa_GetDefaultOutputDevice() )
        {
            printf( (defaultDisplayed ? "," : "[") );
            printf( " Default Output" );
            defaultDisplayed = 1;
        }
        else if( i == Pa_GetHostApiInfo( deviceInfo->hostApi )->defaultOutputDevice )
        {
            const PaHostApiInfo *hostInfo = Pa_GetHostApiInfo( deviceInfo->hostApi );
            printf( (defaultDisplayed ? "," : "[") );                
            printf( " Default %s Output", hostInfo->name );
            defaultDisplayed = 1;
        }

        if( defaultDisplayed )
            printf( " ]\n" );

    /* print device info fields */
#ifdef WIN32
        {   /* Use wide char on windows, so we can show UTF-8 encoded device names */
            wchar_t wideName[MAX_PATH];
            MultiByteToWideChar(CP_UTF8, 0, deviceInfo->name, -1, wideName, MAX_PATH-1);
            wprintf( L"Name                        = %s\n", wideName );
        }
#else
        printf( "Name                        = %s\n", deviceInfo->name );
#endif
        printf( "Host API                    = %s\n",  Pa_GetHostApiInfo( deviceInfo->hostApi )->name );
        printf( "Max inputs = %d", deviceInfo->maxInputChannels  );
        printf( ", Max outputs = %d\n", deviceInfo->maxOutputChannels  );

        printf( "Default low input latency   = %8.4f\n", deviceInfo->defaultLowInputLatency  );
        printf( "Default low output latency  = %8.4f\n", deviceInfo->defaultLowOutputLatency  );
        printf( "Default high input latency  = %8.4f\n", deviceInfo->defaultHighInputLatency  );
        printf( "Default high output latency = %8.4f\n", deviceInfo->defaultHighOutputLatency  );

#ifdef WIN32
#if PA_USE_ASIO
/* ASIO specific latency information */
        if( Pa_GetHostApiInfo( deviceInfo->hostApi )->type == paASIO ){
            long minLatency, maxLatency, preferredLatency, granularity;

            err = PaAsio_GetAvailableLatencyValues( i,
		            &minLatency, &maxLatency, &preferredLatency, &granularity );

            printf( "ASIO minimum buffer size    = %ld\n", minLatency  );
            printf( "ASIO maximum buffer size    = %ld\n", maxLatency  );
            printf( "ASIO preferred buffer size  = %ld\n", preferredLatency  );

            if( granularity == -1 )
                printf( "ASIO buffer granularity     = power of 2\n" );
            else
                printf( "ASIO buffer granularity     = %ld\n", granularity  );
        }
#endif /* PA_USE_ASIO */
#endif /* WIN32 */

        printf( "Default sample rate         = %8.2f\n", deviceInfo->defaultSampleRate );

    /* poll for standard sample rates */
        inputParameters.device = i;
        inputParameters.channelCount = deviceInfo->maxInputChannels;
        inputParameters.sampleFormat = paInt16;
        inputParameters.suggestedLatency = 0; /* ignored by Pa_IsFormatSupported() */
        inputParameters.hostApiSpecificStreamInfo = NULL;
        
        outputParameters.device = i;
        outputParameters.channelCount = deviceInfo->maxOutputChannels;
        outputParameters.sampleFormat = paInt16;
        outputParameters.suggestedLatency = 0; /* ignored by Pa_IsFormatSupported() */
        outputParameters.hostApiSpecificStreamInfo = NULL;

        if( inputParameters.channelCount > 0 )
        {
            printf("Supported standard sample rates\n for half-duplex 16 bit %d channel input = \n",
                    inputParameters.channelCount );
            PrintSupportedStandardSampleRates( &inputParameters, NULL );
        }

        if( outputParameters.channelCount > 0 )
        {
            printf("Supported standard sample rates\n for half-duplex 16 bit %d channel output = \n",
                    outputParameters.channelCount );
            PrintSupportedStandardSampleRates( NULL, &outputParameters );
        }

        if( inputParameters.channelCount > 0 && outputParameters.channelCount > 0 )
        {
            printf("Supported standard sample rates\n for full-duplex 16 bit %d channel input, %d channel output = \n",
                    inputParameters.channelCount, outputParameters.channelCount );
            PrintSupportedStandardSampleRates( &inputParameters, &outputParameters );
        }
    }

    Pa_Terminate();

    printf("----------------------------------------------\n");
    return 0;

error:
    Pa_Terminate();
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return err;
}